

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::LifetimeTests::details::TestBase::TestBase
          (TestBase *this,char *name,char *description,Context *ctx)

{
  TestContext *pTVar1;
  int iVar2;
  deUint32 seed;
  undefined4 extraout_var;
  
  tcu::TestCase::TestCase(&this->super_TestCase,ctx->m_testCtx,name,description);
  iVar2 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar2),
             ctx->m_testCtx->m_log);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestBase_021cc0d0;
  pTVar1 = ctx->m_testCtx;
  (this->m_ctx).m_renderCtx = ctx->m_renderCtx;
  (this->m_ctx).m_testCtx = pTVar1;
  seed = deStringHash(name);
  deRandom_init(&(this->m_rnd).m_rnd,seed);
  (this->super_CallLogWrapper).m_enableLog = true;
  return;
}

Assistant:

TestBase::TestBase (const char* name, const char* description, const Context& ctx)
	: TestCase			(ctx.getTestContext(), name, description)
	, CallLogWrapper	(ctx.gl(), ctx.log())
	, m_ctx				(ctx)
	, m_rnd				(deStringHash(name))
{
	enableLogging(true);
}